

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O3

CTPNStmTop * __thiscall
CTcParser::parse_function
          (CTcParser *this,int *err,int is_extern,int replace,int modify,int func_kw_present)

{
  undefined1 *puVar1;
  byte bVar2;
  int iVar3;
  CTPNCodeBody *pCVar4;
  bool bVar5;
  tc_toktyp_t tVar6;
  CTcToken *pCVar7;
  CTPNCodeBody *pCVar8;
  CTcSymbol *pCVar9;
  CVmHashEntry *this_00;
  CTcSymFunc *this_01;
  CTcSymFunc *pCVar10;
  CTcAbsFixup **ppCVar11;
  undefined4 extraout_var;
  uint uVar12;
  char *pcVar13;
  int iVar14;
  undefined4 has_proto;
  int argc;
  int has_retval;
  int varargs;
  int opt_argc;
  int local_88;
  int varargs_list;
  CTPNCodeBody *local_80;
  CTcFormalTypeList *type_list;
  CTcTokFileDesc *local_70;
  long local_68;
  CTcSymLocal *varargs_list_local;
  CTcToken tok;
  
  local_80 = (CTPNCodeBody *)CONCAT44(local_80._4_4_,modify);
  type_list = (CTcFormalTypeList *)0x0;
  if (func_kw_present == 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (uint)((G_tok->curtok_).typ_ == TOKT_METHOD);
    CTcTokenizer::next(G_tok);
  }
  if ((G_tok->curtok_).typ_ == TOKT_SYM) {
    pCVar7 = CTcTokenizer::copycur(G_tok);
    tok.typ_ = pCVar7->typ_;
    tok._4_4_ = *(undefined4 *)&pCVar7->field_0x4;
    tok.text_ = pCVar7->text_;
    tok.text_len_ = pCVar7->text_len_;
    tok.int_val_ = pCVar7->int_val_;
    tok._32_1_ = pCVar7->field_0x20;
    local_70 = G_tok->last_desc_;
    local_68 = G_tok->last_linenum_;
    tVar6 = CTcTokenizer::next(G_tok);
    if ((tVar6 == TOKT_LPAR) || (tVar6 == TOKT_LBRACE)) {
      if (is_extern == 0) {
        local_88 = replace;
        pCVar8 = parse_code_body(this,0,0,uVar12,&argc,&opt_argc,&varargs,&varargs_list,
                                 &varargs_list_local,&has_retval,err,(CTcPrsSymtab *)0x0,
                                 TCPRS_CB_NORMAL,(propset_def *)0x0,0,(CTcCodeBodyRef *)0x0,
                                 &type_list);
      }
      else {
        if ((G_tok->curtok_).typ_ != TOKT_LPAR) {
          CTcTokenizer::log_error(0x2b5a);
LAB_001d9542:
          parse_code_body(this,0,0,uVar12,&argc,&opt_argc,&varargs,&varargs_list,&varargs_list_local
                          ,&has_retval,err,(CTcPrsSymtab *)0x0,TCPRS_CB_NORMAL,(propset_def *)0x0,0,
                          (CTcCodeBodyRef *)0x0,(CTcFormalTypeList **)0x0);
          return (CTPNStmTop *)(CTPNCodeBody *)0x0;
        }
        local_88 = replace;
        CTcTokenizer::next(G_tok);
        parse_formal_list(this,1,1,&argc,&opt_argc,&varargs,&varargs_list,&varargs_list_local,err,0,
                          0,&type_list);
        tVar6 = (G_tok->curtok_).typ_;
        if ((tVar6 == TOKT_EQ) || (tVar6 == TOKT_LBRACE)) {
          CTcTokenizer::log_error(0x2b5a);
          uVar12 = 0;
          goto LAB_001d9542;
        }
        parse_req_sem();
        has_retval = 1;
        pCVar8 = (CTPNCodeBody *)0x0;
      }
      if (*err != 0) {
        return (CTPNStmTop *)(CTPNCodeBody *)0x0;
      }
      if (is_extern == 0 && pCVar8 == (CTPNCodeBody *)0x0) {
        return (CTPNStmTop *)(CTPNCodeBody *)0x0;
      }
      bVar5 = true;
      has_proto = 1;
      if (type_list != (CTcFormalTypeList *)0x0) {
        pcVar13 = tok.text_;
        pCVar9 = CTcPrsSymtab::find_delete_weak(this->global_symtab_,tok.text_,tok.text_len_);
        if (pCVar9 == (CTcSymbol *)0x0) {
          this_00 = (CVmHashEntry *)
                    CTcSymbolBase::operator_new((CTcSymbolBase *)0x98,(size_t)pcVar13);
          CVmHashEntry::CVmHashEntry(this_00,tok.text_,tok.text_len_,0);
          *(undefined4 *)&this_00->field_0x24 = 1;
          this_00[2].str_ = (char *)0x0;
          *(undefined8 *)&this_00[2].field_0x20 = 0;
          this_00[2].len_ = 0x10;
          this_00[3]._vptr_CVmHashEntry = (_func_int **)0x10;
          this_00[2].nxt_ = (CVmHashEntry *)&PTR__CArrayList_00308ec8;
          this_00[1]._vptr_CVmHashEntry = (_func_int **)0x0;
          this_00[1].nxt_ = (CVmHashEntry *)0x0;
          this_00[1].str_ = (char *)0x0;
          this_00[1].len_ = 0;
          *(undefined8 *)&this_00[1].field_0x20 = 0;
          this_00[2]._vptr_CVmHashEntry = (_func_int **)0x0;
          this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CTcSymFuncBase_00318538;
          *(byte *)&this_00[3].len_ = (byte)this_00[3].len_ & 0xfe;
          this_00[3].str_ = (char *)0x0;
          *(undefined1 *)&this_00[3].nxt_ = 0xf7;
          (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_00);
        }
        else if (*(int *)&(pCVar9->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                          field_0x24 == 1) {
          if ((~*(byte *)&pCVar9[3].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.nxt_
              & 0x14) != 0) {
            iVar14 = 0x2bc8;
            goto LAB_001d97cc;
          }
        }
        else {
          CTcMain::log_error(G_tcmain,local_70,local_68,TC_SEV_ERROR,0x2b58,
                             tok.text_len_ & 0xffffffff,tok.text_);
        }
        bVar5 = true;
        CTcFormalTypeList::decorate_name(type_list,&tok,&tok);
      }
    }
    else {
      if (tVar6 != TOKT_SEM) {
        iVar14 = 0x2b2b;
        goto LAB_001d935f;
      }
      local_88 = replace;
      CTcTokenizer::next(G_tok);
      has_proto = 0;
      if (is_extern == 0) {
        return (CTPNStmTop *)(CTPNCodeBody *)0x0;
      }
      argc = 0;
      opt_argc = 0;
      varargs = 0;
      varargs_list = 0;
      has_retval = 1;
      bVar5 = false;
      pCVar8 = (CTPNCodeBody *)0x0;
    }
    pcVar13 = tok.text_;
    this_01 = (CTcSymFunc *)
              CTcPrsSymtab::find_delete_weak(this->global_symtab_,tok.text_,tok.text_len_);
    if (this_01 == (CTcSymFunc *)0x0) {
      this_01 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x98,(size_t)pcVar13);
      CTcSymFuncBase::CTcSymFuncBase
                ((CTcSymFuncBase *)this_01,tok.text_,tok.text_len_,0,argc,opt_argc,varargs,
                 has_retval,(uint)(type_list != (CTcFormalTypeList *)0x0),0,is_extern,has_proto);
      (this_01->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)&PTR__CTcSymFuncBase_00318538;
      this_01->field_0x90 = this_01->field_0x90 & 0xfe;
      this_01->abs_addr_ = 0;
      (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_01);
      if (((int)local_80 != 0 || local_88 != 0) && ((this->field_0xec & 4) == 0)) {
        CTcTokenizer::log_error(0x2b69);
      }
    }
    else {
      iVar3 = *(int *)&(this_01->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                       super_CVmHashEntryCS.super_CVmHashEntry.field_0x24;
      uVar12 = 1;
      if (iVar3 == 1) {
        uVar12 = (uint)(((local_88 == 0 && (int)local_80 == 0) &&
                        (*(uint *)&(this_01->super_CTcSymFuncBase).field_0x80 >> 2 & 1) == 0) &&
                       is_extern == 0);
      }
      if ((bVar5) && (bVar2 = (this_01->super_CTcSymFuncBase).field_0x80, (char)bVar2 < '\0')) {
        pcVar13 = (char *)0x1;
        if (((this_01->super_CTcSymFuncBase).argc_ == argc) && (varargs == (bVar2 & 1))) {
          pcVar13 = (char *)(ulong)(byte)((bVar2 & 0x10) >> 4 ^
                                         type_list != (CTcFormalTypeList *)0x0);
        }
        uVar12 = uVar12 | (uint)pcVar13;
      }
      if (uVar12 != 0) {
        iVar14 = 0x2b58;
        if (iVar3 == 1) {
          iVar14 = (((local_88 != 0 || (int)local_80 != 0) ||
                    (*(uint *)&(this_01->super_CTcSymFuncBase).field_0x80 >> 2 & 1) != 0) ||
                   is_extern != 0) + 0x2b5b;
        }
LAB_001d97cc:
        CTcMain::log_error(G_tcmain,local_70,local_68,TC_SEV_ERROR,iVar14,(ulong)(uint)tok.text_len_
                           ,tok.text_);
        return (CTPNStmTop *)(CTPNCodeBody *)0x0;
      }
      if (local_88 == 0) {
        if ((int)local_80 != 0) {
          local_80 = pCVar8;
          pCVar10 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x98,(size_t)pcVar13)
          ;
          bVar2 = (this_01->super_CTcSymFuncBase).field_0x80;
          CTcSymFuncBase::CTcSymFuncBase
                    ((CTcSymFuncBase *)pCVar10,"",0,0,argc,opt_argc,varargs,has_retval,
                     bVar2 >> 4 & 1,bVar2 >> 5 & 1,bVar2 >> 2 & 1,(uint)(bVar2 >> 7));
          (pCVar10->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
          super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)&PTR__CTcSymFuncBase_00318538;
          pCVar10->field_0x90 = pCVar10->field_0x90 & 0xfe;
          pCVar10->abs_addr_ = 0;
          (pCVar10->super_CTcSymFuncBase).mod_global_ = this_01;
          pCVar8 = (this_01->super_CTcSymFuncBase).code_body_;
          if (pCVar8 == (CTPNCodeBody *)0x0) {
            pCVar8 = (CTPNCodeBody *)0x0;
          }
          else {
            ppCVar11 = CTcSymFuncBase::get_fixup_list_anchor((CTcSymFuncBase *)pCVar10);
            (pCVar8->super_CTPNCodeBodyBase).fixup_owner_sym_ = pCVar10;
            (pCVar8->super_CTPNCodeBodyBase).fixup_list_anchor_ = ppCVar11;
            pCVar8 = (this_01->super_CTcSymFuncBase).code_body_;
          }
          (pCVar10->super_CTcSymFuncBase).code_body_ = pCVar8;
          (pCVar10->super_CTcSymFuncBase).mod_base_ = (this_01->super_CTcSymFuncBase).mod_base_;
          (this_01->super_CTcSymFuncBase).mod_base_ = pCVar10;
          pCVar8 = local_80;
        }
      }
      else {
        bVar2 = (this_01->super_CTcSymFuncBase).field_0x80;
        if ((bVar2 & 4) == 0) {
          pCVar4 = (this_01->super_CTcSymFuncBase).code_body_;
          if (pCVar4 != (CTPNCodeBody *)0x0) {
            puVar1 = &(pCVar4->super_CTPNCodeBodyBase).field_0xb8;
            *puVar1 = *puVar1 | 4;
          }
          for (pCVar10 = (this_01->super_CTcSymFuncBase).mod_base_; pCVar10 != (CTcSymFunc *)0x0;
              pCVar10 = (pCVar10->super_CTcSymFuncBase).mod_base_) {
            bVar2 = (pCVar10->super_CTcSymFuncBase).field_0x80;
            if ((bVar2 & 4) == 0) {
              pCVar4 = (pCVar10->super_CTcSymFuncBase).code_body_;
              if (pCVar4 != (CTPNCodeBody *)0x0) {
                puVar1 = &(pCVar4->super_CTPNCodeBodyBase).field_0xb8;
                *puVar1 = *puVar1 | 4;
              }
            }
            else {
              (pCVar10->super_CTcSymFuncBase).field_0x80 = bVar2 | 8;
              puVar1 = &(this_01->super_CTcSymFuncBase).field_0x80;
              *puVar1 = *puVar1 | 8;
            }
          }
          (this_01->super_CTcSymFuncBase).mod_base_ = (CTcSymFunc *)0x0;
        }
        else {
          (this_01->super_CTcSymFuncBase).field_0x80 = bVar2 | 8;
        }
      }
      if (is_extern == 0) {
        puVar1 = &(this_01->super_CTcSymFuncBase).field_0x80;
        *puVar1 = *puVar1 & 0xfb;
      }
    }
    if (pCVar8 != (CTPNCodeBody *)0x0) {
      iVar14 = (*(this_01->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0xc])(this_01);
      (pCVar8->super_CTPNCodeBodyBase).fixup_owner_sym_ = this_01;
      (pCVar8->super_CTPNCodeBodyBase).fixup_list_anchor_ =
           (CTcAbsFixup **)CONCAT44(extraout_var,iVar14);
      (this_01->super_CTcSymFuncBase).code_body_ = pCVar8;
      return (CTPNStmTop *)pCVar8;
    }
    (this_01->super_CTcSymFuncBase).code_body_ = (CTPNCodeBody *)0x0;
  }
  else {
    iVar14 = 0x2b2a;
LAB_001d935f:
    CTcTokenizer::log_error_curtok(G_tok,iVar14);
  }
  return (CTPNStmTop *)(CTPNCodeBody *)0x0;
}

Assistant:

CTPNStmTop *CTcParser::parse_function(int *err, int is_extern,
                                      int replace, int modify,
                                      int func_kw_present)
{
    CTcToken tok;
    CTcSymFunc *func_sym;
    CTPNCodeBody *code_body;
    int has_proto = TRUE;
    int argc;
    int opt_argc;
    int varargs;
    int varargs_list;
    CTcSymLocal *varargs_list_local;
    int has_retval;
    int redef;
    CTcTokFileDesc *sym_file;
    long sym_linenum;
    CTcFormalTypeList *type_list = 0;
    int is_method = FALSE;

    /* skip the 'function' or 'method' keyword, if present */
    if (func_kw_present)
    {
        /* note if it's a method definition */
        is_method = (G_tok->cur() == TOKT_METHOD);

        /* skip the token */
        G_tok->next();
    }

    /* we need a symbol */
    if (G_tok->cur() != TOKT_SYM)
    {
        /* log an error */
        G_tok->log_error_curtok(TCERR_FUNC_REQ_SYM);
        
        /* proceed from this token */
        return 0;
    }

    /* remember the symbol token */
    tok = *G_tok->copycur();

    /* remember the location of the symbol (for later error reporting) */
    G_tok->get_last_pos(&sym_file, &sym_linenum);

    /* 
     *   Skip past the function name.  If the next token is a semicolon,
     *   this is a forward declaration; otherwise, we need either an open
     *   brace or an argument list 
     */
    switch(G_tok->next())
    {
    case TOKT_SEM:
        /* it's just a forward declaration - skip the semicolon */
        G_tok->next();

        /* 
         *   if this is an 'extern' declaration, then declare the function
         *   as extern with zero arguments 
         */
        if (is_extern)
        {
            /* no prototype and no arguments */
            has_proto = FALSE;
            argc = 0;
            opt_argc = 0;
            varargs = FALSE;
            varargs_list = FALSE;

            /* assume it has a return value */
            has_retval = TRUE;

            /* no code body */
            code_body = 0;

            /* handle the declaration */
            goto decl_func;
        }

        /* 
         *   A non-extern forward declaration has no effect.  Ignore the
         *   definition and keep going. 
         */
        return 0;
        
    case TOKT_LPAR:
    case TOKT_LBRACE:
        /* 
         *   check whether this is an 'extern' declaration or the actual
         *   definition, and parse accordingly
         */
        if (is_extern)
        {
            /* 
             *   It's external - parse simply the formal parameter list.
             *   A brace is not allowed here. 
             */
            if (G_tok->cur() == TOKT_LPAR)
            {
                /* skip the paren */
                G_tok->next();

                /* parse the formals */
                parse_formal_list(TRUE, TRUE, &argc, &opt_argc, &varargs,
                                  &varargs_list, &varargs_list_local,
                                  err, 0, FALSE, &type_list);

                /* 
                 *   if it looks as though there's a code body, log an
                 *   error and skip and ignore the code body 
                 */
                if (G_tok->cur() == TOKT_LBRACE
                    || G_tok->cur() == TOKT_EQ)
                {
                    /* log the error */
                    G_tok->log_error(TCERR_EXTERN_NO_CODE_BODY);

                    /* parse and ignore the code body */
                    parse_code_body(FALSE, FALSE, FALSE,
                                    &argc, &opt_argc, &varargs,
                                    &varargs_list, &varargs_list_local,
                                    &has_retval, err, 0, TCPRS_CB_NORMAL,
                                    0, 0, 0, 0);

                    /* return failure */
                    return 0;
                }

                /* parse the required terminating semicolon */
                parse_req_sem();
            }
            else
            {
                /* code body is not allowed - log an error */
                G_tok->log_error(TCERR_EXTERN_NO_CODE_BODY);

                /* parse and ignore the code body */
                parse_code_body(FALSE, FALSE, is_method,
                                &argc, &opt_argc, &varargs,
                                &varargs_list, &varargs_list_local,
                                &has_retval, err, 0, TCPRS_CB_NORMAL,
                                0, 0, 0, 0);

                /* done */
                return 0;
            }

            /* there's no code body for an 'extern' definintion */
            code_body = 0;

            /* assume all externals return a value */
            has_retval = TRUE;
        }
        else
        {
            /*
             *   We're parsing the actual definition.  Parse the formal
             *   parameter list and the code body.  
             */
            code_body = parse_code_body(FALSE, FALSE, is_method,
                                        &argc, &opt_argc, &varargs,
                                        &varargs_list, &varargs_list_local,
                                        &has_retval, err, 0, TCPRS_CB_NORMAL,
                                        0, 0, 0, &type_list);
        }

        /* if that failed, do not go on */
        if (*err || (code_body == 0 && !is_extern))
            return 0;

    decl_func:
        /* if we have a type list, generate the decorated name */
        if (type_list != 0)
        {
            /*
             *   The function we're defining here will go by a decorated
             *   name, not the base name, since it's a particular version of
             *   this multi-method.  So, we need to replace the function name
             *   token with the decorated form, which incorporates the typed
             *   parameter list to distinguish this version from other
             *   multi-methods with the same base name and different
             *   parameter type lists.
             *   
             *   Before we generate the decorated name, though, define the
             *   base name as an external multi-method function, so that
             *   we'll know what to do when we see calls to the base
             *   function.  We define the base name as external because the
             *   current source code isn't actually a definition of the base
             *   name; the base name refers to an implied function that's not
             *   actually defined anywhere in the source code, but rather is
             *   generated automatically by the compiler.  As such, the
             *   source we're compiling effectively declares the existence of
             *   a function with the base name, but says that it will be
             *   defined elsewhere - this is, of course, the exact purpose of
             *   an external declaration.
             *   
             *   So, if the base name isn't yet defined, define it as an
             *   external function, and mark it as a multi-method.  Start by
             *   looking up the base function name.  
             */
            func_sym = (CTcSymFunc *)global_symtab_->find_delete_weak(
                tok.get_text(), tok.get_text_len());

            /* 
             *   if it's defined, make sure the existing definition is
             *   compatible; if it's not defined, define it now 
             */
            if (func_sym != 0)
            {
                /* 
                 *   it's previously defined: to be compatible, it has to be
                 *   an external, multi-method function 
                 */
                if (func_sym->get_type() != TC_SYM_FUNC)
                {
                    /* it's already defined as a non-function */
                    G_tcmain->log_error(
                        sym_file, sym_linenum,
                        TC_SEV_ERROR, TCERR_REDEF_AS_FUNC,
                        (int)tok.get_text_len(), tok.get_text());
                }
                else if (!(func_sym->is_extern()
                           && func_sym->is_multimethod()))
                {
                    /* it's already defined incompatibly - flag the error */
                    G_tcmain->log_error(
                        sym_file, sym_linenum,
                        TC_SEV_ERROR, TCERR_FUNC_REDEF_AS_MULTIMETHOD,
                        (int)tok.get_text_len(), tok.get_text());

                    /* ignore the redefinition */
                    return 0;
                }
            }
            else
            {
                /* 
                 *   It's not defined yet, so add it as an external
                 *   multi-method function.  This base form is always a
                 *   varargs function with no fixed arguments, since the
                 *   parameter lists of the different definitions can vary.
                 *   We'll likewise assume that there's a return value, since
                 *   some instances might have returns.  
                 */
                func_sym = new CTcSymFunc(tok.get_text(), tok.get_text_len(),
                                          FALSE, 0, 0, TRUE, TRUE,
                                          TRUE, TRUE, TRUE, TRUE);

                /* 
                 *   Mark the function symbol as defined in this file.  This
                 *   will ensure that we export it to our symbol file, even
                 *   though it's defined here as an extern symbol.  We don't
                 *   normally export externs, since we'd simply count on the
                 *   defining file to export them; but the base symbol for a
                 *   multi-method has no definer at all until link time, so
                 *   *someone* needs to export it.  So export it from any
                 *   file that defines a multi-method with the base name.  
                 */
                func_sym->set_mm_def(TRUE);

                /* add it to the symbol table */
                global_symtab_->add_entry(func_sym);
            }

            /* 
             *   Now we can generate the decorated name.  This name
             *   distinguishes this type-list version of the function from
             *   other versions with the same base name, and is the name by
             *   which the actual function definition will be known.  We'll
             *   also operate on the decorated name for 'replace' or
             *   'modify', since what we're replacing or modifying is this
             *   specific type-list version of the function.  
             */
            type_list->decorate_name(&tok, &tok);
        }

        /* find any existing function symbol */
        func_sym = (CTcSymFunc *)global_symtab_->find_delete_weak(
            tok.get_text(), tok.get_text_len());

        /* 
         *   If the symbol was already defined, the previous definition must
         *   be external, or this new definition must be external, or the new
         *   definition must be a 'replace' definition.
         */
        redef = (func_sym != 0
                 && (func_sym->get_type() != TC_SYM_FUNC
                     || (!func_sym->is_extern()
                         && !is_extern && !replace && !modify)));

        /* 
         *   In addition, if both function definitions have prototypes, the
         *   prototypes must match. 
         */
        if (has_proto && func_sym != 0 && func_sym->has_proto())
        {
            redef |= (func_sym->get_argc() != argc
                      || func_sym->is_varargs() != varargs
                      || func_sym->is_multimethod() != (type_list != 0));
        }

        /* 
         *   If the symbol was already defined, log an error, then ignore
         *   the redefinition and return an empty statement.  Note that we
         *   waited until now because we still wanted to parse the syntax
         *   of the function, but we can't really do anything with it once
         *   we're finished with the parsing.  
         */
        if (redef)
        {
            int err;
            
            /* 
             *   Note the problem.  Select the error message to display
             *   depending on whether the symbol was previously defined as
             *   a function (in which case the problem is the conflicting
             *   prototype) or as another type.  
             */
            if (func_sym->get_type() == TC_SYM_FUNC)
            {
                /* 
                 *   if one or the other definition is external, or we're
                 *   replacing the function, the problem is a mismatch in
                 *   the parameter lists; otherwise, the problem is that
                 *   the function is simply defined twice 
                 */
                if (func_sym->is_extern() || is_extern || replace || modify)
                    err = TCERR_INCOMPAT_FUNC_REDEF;
                else
                    err = TCERR_FUNC_REDEF;
            }
            else
            {
                /* it's being redefined as a new type */
                err = TCERR_REDEF_AS_FUNC;
            }

            /* log the error (at the symbol's position) */
            G_tcmain->log_error(sym_file, sym_linenum, TC_SEV_ERROR, err,
                                (int)tok.get_text_len(), tok.get_text());

            /* ignore the re-definition */
            return 0;
        }

        /* 
         *   create a symbol table entry for the function if we didn't
         *   have on already 
         */
        if (func_sym == 0)
        {
            /* we didn't have a symbol previously - create one */
            func_sym = new CTcSymFunc(tok.get_text(), tok.get_text_len(),
                                      FALSE, argc, opt_argc, varargs,
                                      has_retval, type_list != 0,
                                      FALSE, is_extern, has_proto);

            /* add the entry to the global symbol table */
            global_symtab_->add_entry(func_sym);

            /* 
             *   We can't replace/modify a function that wasn't previously
             *   defined - if we're replacing it, note the error.  Don't
             *   bother with this check if we're parsing only for syntax.  
             */
            if ((replace || modify) && !syntax_only_)
                G_tok->log_error(TCERR_REPFUNC_UNDEF);
        }
        else
        {
            /* replace or modify the previous definition if appropriate */
            if (replace)
            {
                /* 
                 *   check to see whether it's external or previously
                 *   defined in the same translation unit 
                 */
                if (func_sym->is_extern())
                {
                    /* 
                     *   The function was previously external, and we're
                     *   replacing it -- mark it as such so that we'll
                     *   know to perform the replacement at link time.  We
                     *   only need to do this when replacing an external
                     *   function, because if the function is defined in
                     *   the same translation unit then the replacement
                     *   will be completed right now, and we don't need to
                     *   do any more work at link time.  
                     */
                    func_sym->set_ext_replace(TRUE);
                }
                else
                {
                    CTcSymFunc *mod_base;

                    /*
                     *   The function was previously defined in the same
                     *   translation unit.  Mark the previous code body as
                     *   replaced so that we don't bother generating any
                     *   code for it. 
                     */
                    if (func_sym->get_code_body() != 0)
                        func_sym->get_code_body()->set_replaced(TRUE);

                    /*
                     *   If the function we're replacing modifies any base
                     *   functions, we're effectively replacing all of the
                     *   base functions as well.  None of these functions
                     *   will be reachable, since a modified base function is
                     *   only reachable through its modifying function; since
                     *   the function we're replacing is becoming
                     *   unreachable, therefore, all of its base functions
                     *   are as well.  
                     */
                    for (mod_base = func_sym->get_mod_base() ; mod_base != 0 ;
                         mod_base = mod_base->get_mod_base())
                    {
                        /* mark this base function as replaced */
                        if (mod_base->is_extern())
                        {
                            /* mark it as a replaced extern */
                            mod_base->set_ext_replace(TRUE);

                            /* note that our function replaces an external */
                            func_sym->set_ext_replace(TRUE);
                        }
                        else if (mod_base->get_code_body() != 0)
                        {
                            /* mark its code body as replaced */
                            mod_base->get_code_body()->set_replaced(TRUE);
                        }
                    }

                    /* 
                     *   since we're replacing the function, it no longer
                     *   has any modified base functions 
                     */
                    func_sym->set_mod_base(0);
                }
            }
            else if (modify)
            {
                CTcSymFunc *mod_sym;

                /* 
                 *   Create a new dummy symbol for the original version.
                 *   This symbol doesn't go in the symbol table; instead, we
                 *   link it into our modified base function list behind the
                 *   symbol table entry.
                 *   
                 *   The name is important, though: we have to give this an
                 *   empty name so that the object file reader will know that
                 *   this isn't an actual global symbol.  This will let the
                 *   object file loader's code stream reader know that it
                 *   can't fix up references to the code stream anchor by
                 *   looking at the global symbol table.  (We have to write
                 *   some extra code in the function symbol loader to deal
                 *   with this, since the code stream reader can't.)
                 *   
                 *   Note that we want the new base function symbol to keep
                 *   the same 'extern' attribute as the original symbol.  If
                 *   we're modifying an external function, this will allow us
                 *   to apply the modification at link time between this
                 *   module and the module where the imported original
                 *   function was defined.  
                 */
                mod_sym = new CTcSymFunc("", 0, FALSE,
                                         argc, opt_argc, varargs, has_retval,
                                         func_sym->is_multimethod(),
                                         func_sym->is_multimethod_base(),
                                         func_sym->is_extern(),
                                         func_sym->has_proto());

                /* 
                 *   remember the original global function in the modified
                 *   placeholder symbol 
                 */
                mod_sym->set_mod_global(func_sym);

                /* 
                 *   If the original has a code body, switch the code body to
                 *   use our new symbol's fixup list.
                 *   
                 *   The only way to reference the original code body is
                 *   through a 'replaced()' call in the modifying function,
                 *   so any fixups currently associated with the function
                 *   symbol should remain with the function symbol - in other
                 *   words, we don't have to move any existing fixups
                 *   anywhere.  
                 */
                if (func_sym->get_code_body() != 0)
                    func_sym->get_code_body()->set_symbol_fixup_list(
                        mod_sym, mod_sym->get_fixup_list_anchor());

                /* transfer the old code body to the modified base symbol */
                mod_sym->set_code_body(func_sym->get_code_body());

                /* 
                 *   put the new modified base function at the head of the
                 *   modified base list 
                 */
                mod_sym->set_mod_base(func_sym->get_mod_base());
                func_sym->set_mod_base(mod_sym);
            }
            
            /* 
             *   The function was already defined.  If this is an actual
             *   definition (not an 'extern' declaration), then clear the
             *   'extern' flag on the existing symbol.  
             */
            if (!is_extern)
                func_sym->set_extern(FALSE);
        }

        /* 
         *   If there's a code body, tell the code body about its symbol
         *   table entry.  (If the function is 'extern' it has no code
         *   body at this point.)  
         */
        if (code_body != 0)
            code_body->set_symbol_fixup_list(
                func_sym, func_sym->get_fixup_list_anchor());

        /* tell the function about its code body */
        func_sym->set_code_body(code_body);

        /* return the code body as the result */
        return code_body;

    default:
        /* log an error and continue from here */
        G_tok->log_error_curtok(TCERR_REQ_CODE_BODY);
        return 0;
    }
}